

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8_int8.h
# Opt level: O0

void ncnn::padding_reflect_pack8_int8_sse(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  int local_84;
  int local_80;
  int x_8;
  int x_7;
  int x_6;
  int64_t *ptr0_1;
  int y_2;
  int x_5;
  int x_4;
  int x_3;
  int y_1;
  int x_2;
  int x_1;
  int x;
  int64_t *ptr0;
  int64_t *piStack_40;
  int y;
  int64_t *outptr;
  int64_t *ptr;
  int right_local;
  int left_local;
  int bottom_local;
  int top_local;
  Mat *dst_local;
  Mat *src_local;
  
  piStack_40 = (int64_t *)dst->data;
  outptr = (int64_t *)((long)src->data + (long)(top * src->w) * 8);
  for (ptr0._4_4_ = 0; ptr0._4_4_ < top; ptr0._4_4_ = ptr0._4_4_ + 1) {
    _x_1 = outptr;
    for (x_2 = 0; x_2 < left; x_2 = x_2 + 1) {
      *piStack_40 = outptr[left - x_2];
      piStack_40 = piStack_40 + 1;
    }
    for (y_1 = 0; y_1 < src->w; y_1 = y_1 + 1) {
      *piStack_40 = *_x_1;
      _x_1 = _x_1 + 1;
      piStack_40 = piStack_40 + 1;
    }
    for (x_3 = 0; x_3 < right; x_3 = x_3 + 1) {
      *piStack_40 = _x_1[-2 - x_3];
      piStack_40 = piStack_40 + 1;
    }
    outptr = outptr + -(long)src->w;
  }
  for (x_4 = 0; x_4 < src->h; x_4 = x_4 + 1) {
    for (x_5 = 0; x_5 < left; x_5 = x_5 + 1) {
      *piStack_40 = outptr[left - x_5];
      piStack_40 = piStack_40 + 1;
    }
    for (y_2 = 0; y_2 < src->w; y_2 = y_2 + 1) {
      *piStack_40 = *outptr;
      piStack_40 = piStack_40 + 1;
      outptr = outptr + 1;
    }
    for (ptr0_1._4_4_ = 0; ptr0_1._4_4_ < right; ptr0_1._4_4_ = ptr0_1._4_4_ + 1) {
      *piStack_40 = outptr[-2 - ptr0_1._4_4_];
      piStack_40 = piStack_40 + 1;
    }
  }
  outptr = outptr + -(long)(src->w << 1);
  for (ptr0_1._0_4_ = 0; (int)ptr0_1 < bottom; ptr0_1._0_4_ = (int)ptr0_1 + 1) {
    _x_7 = outptr;
    for (x_8 = 0; x_8 < left; x_8 = x_8 + 1) {
      *piStack_40 = outptr[left - x_8];
      piStack_40 = piStack_40 + 1;
    }
    for (local_80 = 0; local_80 < src->w; local_80 = local_80 + 1) {
      *piStack_40 = *_x_7;
      _x_7 = _x_7 + 1;
      piStack_40 = piStack_40 + 1;
    }
    for (local_84 = 0; local_84 < right; local_84 = local_84 + 1) {
      *piStack_40 = _x_7[-2 - local_84];
      piStack_40 = piStack_40 + 1;
    }
    outptr = outptr + -(long)src->w;
  }
  return;
}

Assistant:

static void padding_reflect_pack8_int8_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const int64_t* ptr = src;
    int64_t* outptr = dst;

    // fill top
    ptr += top * src.w;
    for (int y = 0; y < top; y++)
    {
        const int64_t* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            *outptr++ = ptr0[left - x];
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr0++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = ptr0[-2 - x];
        }
        ptr -= src.w;
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            *outptr++ = ptr[left - x];
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = ptr[-2 - x];
        }
    }
    // fill bottom
    ptr -= 2 * src.w;
    for (int y = 0; y < bottom; y++)
    {
        const int64_t* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            *outptr++ = ptr0[left - x];
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr0++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = ptr0[-2 - x];
        }
        ptr -= src.w;
    }
}